

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * __thiscall Omega_h::TernaryOp::eval(any *__return_storage_ptr__,TernaryOp *this,ExprEnv *env)

{
  LO size;
  Int dim;
  element_type *peVar1;
  any local_78;
  undefined1 local_50 [8];
  any rhs_val;
  any lhs_val;
  ExprEnv *env_local;
  TernaryOp *this_local;
  
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->lhs);
  (*peVar1->_vptr_ExprOp[2])(&rhs_val.vtable,peVar1,env);
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->rhs);
  (*peVar1->_vptr_ExprOp[2])(local_50,peVar1,env);
  anon_unknown_41::promote(env->size,env->dim,(any *)&rhs_val.vtable,(any *)local_50);
  size = env->size;
  dim = env->dim;
  peVar1 = std::__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->cond);
  (*peVar1->_vptr_ExprOp[2])(&local_78,peVar1,env);
  anon_unknown_41::ternary
            (__return_storage_ptr__,size,dim,&local_78,(any *)&rhs_val.vtable,(any *)local_50);
  any::~any(&local_78);
  any::~any((any *)local_50);
  any::~any((any *)&rhs_val.vtable);
  return __return_storage_ptr__;
}

Assistant:

any TernaryOp::eval(ExprEnv& env) {
  auto lhs_val = lhs->eval(env);
  auto rhs_val = rhs->eval(env);
  promote(env.size, env.dim, lhs_val, rhs_val);
  return ternary(env.size, env.dim, cond->eval(env), lhs_val, rhs_val);
}